

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O3

Estimate<double> * __thiscall
Catch::Benchmark::Detail::
bootstrap<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double(*&)(__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>)>
          (Estimate<double> *__return_storage_ptr__,Detail *this,double confidence_level,
          __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> first,
          __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> last,
          sample *resample,
          _func_double___normal_iterator<double_ptr,_std::vector<double,_std::allocator<double>_>_>___normal_iterator<double_ptr,_std::vector<double,_std::allocator<double>_>_>
          **estimator)

{
  double *pdVar1;
  pointer pdVar2;
  double *pdVar3;
  long lVar4;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> last_00;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  sample jack;
  sample local_48;
  
  last_00._M_current = (double *)resample;
  dVar8 = (double)(*(code *)(resample->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_start)(this,first._M_current);
  if ((long)first._M_current - (long)this == 8) {
    __return_storage_ptr__->point = dVar8;
    __return_storage_ptr__->lower_bound = dVar8;
    __return_storage_ptr__->upper_bound = dVar8;
    __return_storage_ptr__->confidence_interval = confidence_level;
  }
  else {
    jackknife<double(*&)(__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>),__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
              (&local_48,(Detail *)resample,
               (_func_double___normal_iterator<double_ptr,_std::vector<double,_std::allocator<double>_>_>___normal_iterator<double_ptr,_std::vector<double,_std::allocator<double>_>_>
                **)this,first,last_00);
    dVar9 = 0.0;
    dVar14 = 0.0;
    if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start !=
        local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish) {
      dVar11 = 0.0;
      pdVar2 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        dVar11 = dVar11 + *pdVar2;
        pdVar2 = pdVar2 + 1;
      } while (pdVar2 != local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish);
      dVar14 = 0.0;
      dVar9 = 0.0;
      pdVar2 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        dVar13 = dVar11 / (double)((long)local_48.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_finish -
                                   (long)local_48.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_start >> 3) - *pdVar2;
        dVar14 = dVar14 + dVar13 * dVar13 * dVar13;
        dVar9 = dVar9 + dVar13 * dVar13;
        pdVar2 = pdVar2 + 1;
      } while (pdVar2 != local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish);
    }
    dVar9 = pow(dVar9,1.5);
    pdVar3 = (double *)*last._M_current;
    pdVar1 = (double *)last._M_current[1];
    uVar7 = (long)pdVar1 - (long)pdVar3;
    dVar11 = 0.0;
    if (pdVar1 != pdVar3) {
      lVar4 = 0;
      do {
        lVar4 = lVar4 + (ulong)(*pdVar3 <= dVar8 && dVar8 != *pdVar3);
        pdVar3 = pdVar3 + 1;
      } while (pdVar3 != pdVar1);
      dVar11 = (double)lVar4;
    }
    iVar6 = (int)(uVar7 >> 3);
    dVar13 = (double)iVar6;
    dVar11 = dVar11 / dVar13;
    if ((dVar11 != 0.0) || (dVar12 = dVar8, dVar10 = dVar8, NAN(dVar11))) {
      dVar11 = normal_quantile(dVar11);
      dVar10 = normal_quantile((1.0 - confidence_level) * 0.5);
      dVar14 = -dVar14 / (dVar9 * 6.0);
      dVar9 = erfc(((dVar11 + dVar10) / (dVar14 * (dVar11 + dVar10) + 1.0) + dVar11) /
                   -1.4142135623730951);
      uVar7 = lround(dVar9 * 0.5 * dVar13);
      uVar5 = 0;
      if (0 < (int)uVar7) {
        uVar5 = uVar7 & 0xffffffff;
      }
      dVar9 = erfc(((dVar11 - dVar10) / (dVar14 * (dVar11 - dVar10) + 1.0) + dVar11) /
                   -1.4142135623730951);
      lVar4 = lround(dVar9 * 0.5 * dVar13);
      iVar6 = iVar6 + -1;
      if ((int)lVar4 <= iVar6) {
        iVar6 = (int)lVar4;
      }
      dVar10 = *(double *)((long)*last._M_current + uVar5 * 8);
      dVar12 = *(double *)((long)*last._M_current + (long)iVar6 * 8);
    }
    __return_storage_ptr__->point = dVar8;
    __return_storage_ptr__->lower_bound = dVar10;
    __return_storage_ptr__->upper_bound = dVar12;
    __return_storage_ptr__->confidence_interval = confidence_level;
    if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (double *)0x0) {
      operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Estimate<double> bootstrap(double confidence_level, Iterator first, Iterator last, sample const& resample, Estimator&& estimator) {
                auto n_samples = last - first;

                double point = estimator(first, last);
                // Degenerate case with a single sample
                if (n_samples == 1) return { point, point, point, confidence_level };

                sample jack = jackknife(estimator, first, last);
                double jack_mean = mean(jack.begin(), jack.end());
                double sum_squares, sum_cubes;
                std::tie(sum_squares, sum_cubes) = std::accumulate(jack.begin(), jack.end(), std::make_pair(0., 0.), [jack_mean](std::pair<double, double> sqcb, double x) -> std::pair<double, double> {
                    auto d = jack_mean - x;
                    auto d2 = d * d;
                    auto d3 = d2 * d;
                    return { sqcb.first + d2, sqcb.second + d3 };
                });

                double accel = sum_cubes / (6 * std::pow(sum_squares, 1.5));
                int n = static_cast<int>(resample.size());
                double prob_n = std::count_if(resample.begin(), resample.end(), [point](double x) { return x < point; }) / (double)n;
                // degenerate case with uniform samples
                if (prob_n == 0) return { point, point, point, confidence_level };

                double bias = normal_quantile(prob_n);
                double z1 = normal_quantile((1. - confidence_level) / 2.);

                auto cumn = [n](double x) -> int {
                    return std::lround(normal_cdf(x) * n); };
                auto a = [bias, accel](double b) { return bias + b / (1. - accel * b); };
                double b1 = bias + z1;
                double b2 = bias - z1;
                double a1 = a(b1);
                double a2 = a(b2);
                auto lo = std::max(cumn(a1), 0);
                auto hi = std::min(cumn(a2), n - 1);

                return { point, resample[lo], resample[hi], confidence_level };
            }